

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

_Bool inlist(curl_slist *head,char *checkfor)

{
  int iVar1;
  size_t sVar2;
  _Bool _Var3;
  
  sVar2 = strlen(checkfor);
  _Var3 = head != (curl_slist *)0x0;
  if (_Var3) {
    do {
      iVar1 = curl_strnequal(head->data,checkfor,sVar2);
      if ((iVar1 != 0) && ((head->data[sVar2] & 0xfeU) == 0x3a)) {
        return _Var3;
      }
      head = head->next;
      _Var3 = head != (curl_slist *)0x0;
    } while (_Var3);
  }
  return _Var3;
}

Assistant:

static bool inlist(const struct curl_slist *head,
                   const char *checkfor)
{
  size_t thislen = strlen(checkfor);
  DEBUGASSERT(thislen);
  DEBUGASSERT(checkfor[thislen-1] != ':');

  for(; head; head = head->next) {
    if(curl_strnequal(head->data, checkfor, thislen) &&
       isheadersep(head->data[thislen]) )
      return TRUE;
  }

  return FALSE;
}